

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void cconv_substruct_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,int32_t *ip,CTInfo flags)

{
  CType *d_00;
  ushort uVar1;
  uint uVar2;
  CType *pCVar3;
  ushort uVar4;
  uint32_t uVar5;
  cTValue *o;
  uint key;
  bool bVar6;
  
  uVar4 = d->sib;
  do {
    do {
      while( true ) {
        if (uVar4 == 0) {
          return;
        }
        pCVar3 = cts->tab;
        d_00 = pCVar3 + uVar4;
        uVar1 = pCVar3[uVar4].sib;
        uVar2 = pCVar3[uVar4].info;
        uVar4 = uVar1;
        if ((uVar2 >> 0x1c) - 9 < 2) break;
        if ((uVar2 & 0xf0ff0000) == 0x80030000) {
          cconv_substruct_tab(cts,(CType *)((long)&pCVar3->info + (ulong)((uVar2 & 0xffff) << 4)),
                              dp + d_00->size,t,ip,flags);
        }
      }
      uVar5 = (d_00->name).gcptr32;
    } while (uVar5 == 0);
    uVar2 = *ip;
    key = uVar2;
    if (-1 < (int)uVar2) {
      do {
        if (key < t->asize) {
          o = (cTValue *)((ulong)(t->array).ptr32 + (ulong)key * 8);
        }
        else {
          o = lj_tab_getinth(t,key);
        }
        if ((o != (cTValue *)0x0) && ((o->field_2).it != 0xffffffff)) {
          *ip = key + 1;
          goto LAB_00138217;
        }
        bVar6 = key == 0;
        key = 1;
      } while (bVar6);
      if (uVar2 != 0) {
        return;
      }
      *ip = -1;
      uVar5 = (d_00->name).gcptr32;
    }
    o = lj_tab_getstr(t,(GCstr *)(ulong)uVar5);
    if ((o != (cTValue *)0x0) && ((o->field_2).it != 0xffffffff)) {
LAB_00138217:
      if ((d_00->info & 0xf0000000) == 0x90000000) {
        lj_cconv_ct_tv(cts,(CType *)((long)&cts->tab->info + (ulong)((d_00->info & 0xffff) << 4)),
                       dp + d_00->size,o,flags);
      }
      else {
        lj_cconv_bf_tv(cts,d_00,dp + d_00->size,o);
      }
      if ((d->info & 0x800000) != 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void cconv_substruct_tab(CTState *cts, CType *d, uint8_t *dp,
				GCtab *t, int32_t *ip, CTInfo flags)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      TValue *tv;
      int32_t i = *ip, iz = i;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= 0) {
      retry:
	tv = (TValue *)lj_tab_getint(t, i);
	if (!tv || tvisnil(tv)) {
	  if (i == 0) { i = 1; goto retry; }  /* 1-based tables. */
	  if (iz == 0) { *ip = i = -1; goto tryname; }  /* Init named fields. */
	  break;  /* Stop at first nil. */
	}
	*ip = i + 1;
      } else {
      tryname:
	tv = (TValue *)lj_tab_getstr(t, gco2str(gcref(df->name)));
	if (!tv || tvisnil(tv)) continue;
      }
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, tv, flags);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, tv);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_tab(cts, ctype_rawchild(cts, df),
			  dp+df->size, t, ip, flags);
    }  /* Ignore all other entries in the chain. */
  }
}